

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inner-lib-tests.cpp
# Opt level: O0

void MultiLibTest(bool *result)

{
  LibClass *pLVar1;
  LibClass *this;
  size_t sVar2;
  LibClass *libClass;
  uint64_t memLeakSize;
  size_t memLeakCount;
  bool *result_local;
  
  memLeakCount = (size_t)result;
  MemPlumber::start(false,"",false);
  this = (LibClass *)operator_new(0x50);
  LibClass::LibClass(this);
  MemPlumber::memLeakCheck(&memLeakSize,(uint64_t *)&libClass,false,"",false);
  pLVar1 = libClass;
  if (memLeakSize == 4) {
    sVar2 = LibClass::getSizeOfInternalClass();
    if (pLVar1 == (LibClass *)(sVar2 + 0x58)) {
      LibClass::doSomething(this);
      MemPlumber::memLeakCheck(&memLeakSize,(uint64_t *)&libClass,false,"",false);
      pLVar1 = libClass;
      if (memLeakSize == 0x2c) {
        sVar2 = LibClass::getSizeOfInternalClass();
        if (pLVar1 == (LibClass *)(sVar2 * 0x15 + 0x58)) {
          if (this != (LibClass *)0x0) {
            LibClass::~LibClass(this);
            operator_delete(this,0x50);
          }
          MemPlumber::memLeakCheck(&memLeakSize,(uint64_t *)&libClass,false,"",false);
          pLVar1 = libClass;
          if (memLeakSize == 0x28) {
            sVar2 = LibClass::getSizeOfInternalClass();
            if (pLVar1 == (LibClass *)(sVar2 * 0x14)) {
              MemPlumber::stopAndFreeAllMemory();
            }
            else {
              sVar2 = LibClass::getSizeOfInternalClass();
              printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n",
                     "MultiLibTest",0x13,(ulong)libClass & 0xffffffff,
                     (ulong)(uint)((int)sVar2 * 0x14));
              *(undefined1 *)memLeakCount = 0;
            }
          }
          else {
            printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n","MultiLibTest"
                   ,0x13,memLeakSize & 0xffffffff,0x28);
            *(undefined1 *)memLeakCount = 0;
          }
        }
        else {
          sVar2 = LibClass::getSizeOfInternalClass();
          printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n","MultiLibTest",
                 0xf,(ulong)libClass & 0xffffffff,(ulong)((int)sVar2 * 0x15 + 0x58));
          *(undefined1 *)memLeakCount = 0;
        }
      }
      else {
        printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n","MultiLibTest",0xf
               ,memLeakSize & 0xffffffff,0x2c);
        *(undefined1 *)memLeakCount = 0;
      }
    }
    else {
      sVar2 = LibClass::getSizeOfInternalClass();
      printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n","MultiLibTest",0xb,
             (ulong)libClass & 0xffffffff,(ulong)((int)sVar2 + 0x58));
      *(undefined1 *)memLeakCount = 0;
    }
  }
  else {
    printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n","MultiLibTest",0xb,
           memLeakSize & 0xffffffff,4);
    *(undefined1 *)memLeakCount = 0;
  }
  return;
}

Assistant:

TEST_CASE(MultiLibTest) {

    START_TEST;

    LibClass* libClass = new LibClass();

    CHECK_MEM_LEAK(4, sizeof(LibClass) + sizeof(double) + LibClass::getSizeOfInternalClass());

    libClass->doSomething();

    CHECK_MEM_LEAK(44, sizeof(LibClass) + sizeof(double) + 21*LibClass::getSizeOfInternalClass());

    delete libClass;

    CHECK_MEM_LEAK(40, 20*libClass->getSizeOfInternalClass());

    STOP_TEST;
}